

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SlidingWindowsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_slidingwindows
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  SlidingWindowsLayerParams *pSVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x3ed) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ed;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pSVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SlidingWindowsLayerParams>(arena);
    (this->layer_).slidingwindows_ = pSVar2;
  }
  return (SlidingWindowsLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SlidingWindowsLayerParams* NeuralNetworkLayer::_internal_mutable_slidingwindows() {
  if (!_internal_has_slidingwindows()) {
    clear_layer();
    set_has_slidingwindows();
    layer_.slidingwindows_ = CreateMaybeMessage< ::CoreML::Specification::SlidingWindowsLayerParams >(GetArenaForAllocation());
  }
  return layer_.slidingwindows_;
}